

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::readArray(Reader *this,Token *tokenStart)

{
  int index_00;
  Value *pVVar1;
  bool local_106;
  bool local_104;
  allocator<char> local_d1;
  string local_d0;
  bool local_a9;
  undefined1 local_a8 [7];
  bool badTokenType;
  Token token;
  Value *pVStack_88;
  bool ok;
  Value *local_80;
  Value *value;
  int index;
  Token endArray;
  undefined1 local_48 [8];
  Value init;
  Token *tokenStart_local;
  Reader *this_local;
  
  init.limit_ = (ptrdiff_t)tokenStart;
  Value::Value((Value *)local_48,arrayValue);
  pVVar1 = currentValue(this);
  Value::swapPayload(pVVar1,(Value *)local_48);
  pVVar1 = currentValue(this);
  Value::setOffsetStart(pVVar1,*(long *)(init.limit_ + 8) - (long)this->begin_);
  skipSpaces(this);
  if ((this->current_ == this->end_) || (*this->current_ != ']')) {
    value._0_4_ = 0;
    do {
      pVVar1 = currentValue(this);
      index_00 = (int)value;
      value._0_4_ = (int)value + 1;
      pVStack_88 = Value::operator[](pVVar1,index_00);
      local_80 = pVStack_88;
      std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::push
                (&this->nodes_,&stack0xffffffffffffff78);
      token.end_._7_1_ = readValue(this);
      std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::pop
                (&this->nodes_);
      if ((token.end_._7_1_ & 1) == 0) {
        this_local._7_1_ = recoverFromError(this,tokenArrayEnd);
        goto LAB_007b2867;
      }
      token.end_._7_1_ = readToken(this,(Token *)local_a8);
      while( true ) {
        local_104 = false;
        if (local_a8._0_4_ == tokenComment) {
          local_104 = (bool)token.end_._7_1_;
        }
        if (local_104 == false) break;
        token.end_._7_1_ = readToken(this,(Token *)local_a8);
      }
      local_106 = local_a8._0_4_ != tokenArraySeparator && local_a8._0_4_ != tokenArrayEnd;
      local_a9 = local_106;
      if (((bool)token.end_._7_1_ == false) ||
         (local_a8._0_4_ != tokenArraySeparator && local_a8._0_4_ != tokenArrayEnd)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"Missing \',\' or \']\' in array declaration",&local_d1);
        this_local._7_1_ = addErrorAndRecover(this,&local_d0,(Token *)local_a8,tokenArrayEnd);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator(&local_d1);
        goto LAB_007b2867;
      }
    } while (local_a8._0_4_ != tokenArrayEnd);
    this_local._7_1_ = true;
  }
  else {
    readToken(this,(Token *)&index);
    this_local._7_1_ = true;
  }
LAB_007b2867:
  value._4_4_ = 1;
  Value::~Value((Value *)local_48);
  return this_local._7_1_;
}

Assistant:

bool Reader::readArray(Token& tokenStart) {
  Value init(arrayValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  skipSpaces();
  if (current_ != end_ && *current_ == ']') // empty array
  {
    Token endArray;
    readToken(endArray);
    return true;
  }
  int index = 0;
  for (;;) {
    Value& value = currentValue()[index++];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenArrayEnd);

    Token token;
    // Accept Comment after last item in the array.
    ok = readToken(token);
    while (token.type_ == tokenComment && ok) {
      ok = readToken(token);
    }
    bool badTokenType =
        (token.type_ != tokenArraySeparator && token.type_ != tokenArrayEnd);
    if (!ok || badTokenType) {
      return addErrorAndRecover(
          "Missing ',' or ']' in array declaration", token, tokenArrayEnd);
    }
    if (token.type_ == tokenArrayEnd)
      break;
  }
  return true;
}